

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O2

void __thiscall hello::view_test(hello *this,string *skin)

{
  string *psVar1;
  hello c;
  allocator local_1539;
  string local_1538 [32];
  hello local_1518;
  
  view::hello::hello(&local_1518);
  if (skin->_M_string_length != 0) {
    psVar1 = (string *)cppcms::application::context();
    cppcms::http::context::skin(psVar1);
  }
  std::__cxx11::string::string(local_1538,"hello",&local_1539);
  cppcms::application::render(this,local_1538,&local_1518);
  std::__cxx11::string::~string(local_1538);
  view::hello::~hello(&local_1518);
  return;
}

Assistant:

void view_test(std::string skin)
	{
		view::hello c;
		if(!skin.empty())
			context().skin(skin);
		render("hello",c);
	}